

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O0

ComputePipelineStateCreateInfoX * __thiscall
Diligent::
PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
::RemoveObject(PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
               *this,IDeviceObject *pObject)

{
  bool bVar1;
  pointer this_00;
  RefCntAutoPtr<Diligent::IDeviceObject> *pRVar2;
  const_iterator local_38;
  RefCntAutoPtr<Diligent::IDeviceObject> *local_30;
  __normal_iterator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_*,_std::vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>_>
  local_28;
  __normal_iterator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_*,_std::vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>_>
  local_20;
  iterator it;
  IDeviceObject *pObject_local;
  PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
  *this_local;
  
  it._M_current = (RefCntAutoPtr<Diligent::IDeviceObject> *)pObject;
  local_20._M_current =
       (RefCntAutoPtr<Diligent::IDeviceObject> *)
       std::
       vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
       ::begin(&this->Objects);
  while( true ) {
    local_28._M_current =
         (RefCntAutoPtr<Diligent::IDeviceObject> *)
         std::
         vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
         ::end(&this->Objects);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_*,_std::vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>_>
              ::operator->(&local_20);
    pRVar2 = (RefCntAutoPtr<Diligent::IDeviceObject> *)
             RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr(this_00);
    if (pRVar2 == it._M_current) {
      __gnu_cxx::
      __normal_iterator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>const*,std::vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>>
      ::__normal_iterator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>*>
                ((__normal_iterator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>const*,std::vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>>
                  *)&local_38,&local_20);
      local_30 = (RefCntAutoPtr<Diligent::IDeviceObject> *)
                 std::
                 vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
                 ::erase(&this->Objects,local_38);
      local_20._M_current = local_30;
    }
    else {
      __gnu_cxx::
      __normal_iterator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_*,_std::vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>_>
      ::operator++(&local_20);
    }
  }
  return (ComputePipelineStateCreateInfoX *)this;
}

Assistant:

DerivedType& RemoveObject(IDeviceObject* pObject)
    {
        for (auto it = Objects.begin(); it != Objects.end();)
        {
            if (it->RawPtr() == pObject)
                it = Objects.erase(it);
            else
                ++it;
        }

        return static_cast<DerivedType&>(*this);
    }